

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeParameters.cpp
# Opt level: O3

void __thiscall
OpenMD::FluctuatingChargeParameters::FluctuatingChargeParameters(FluctuatingChargeParameters *this)

{
  _Rb_tree_header *p_Var1;
  ParamMap *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  size_type local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  ParameterBase *local_c0;
  string *local_b8;
  ParameterBase *local_b0;
  string *local_a8;
  ParameterBase *local_a0;
  string *local_98;
  ParameterBase *local_90;
  string *local_88;
  ParameterBase *local_80;
  string *local_78;
  ParameterBase *local_70;
  string *local_68;
  ParameterBase *local_60;
  string *local_58;
  ParameterBase *local_50;
  ParameterBase *local_48;
  string *local_40;
  ParameterBase *local_38;
  
  p_Var1 = &(this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_DataHolder)._vptr_DataHolder =
       (_func_int **)&PTR__FluctuatingChargeParameters_002b83b0;
  local_38 = &(this->Propagator).super_ParameterBase;
  (this->Propagator).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->Propagator).super_ParameterBase.keyword_.field_2;
  (this->Propagator).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Propagator).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Propagator).super_ParameterBase.optional_ = false;
  (this->Propagator).super_ParameterBase.defaultValue_ = false;
  (this->Propagator).super_ParameterBase.empty_ = true;
  (this->Propagator).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002b8078;
  (this->Propagator).data_._M_dataplus._M_p = (pointer)&(this->Propagator).data_.field_2;
  (this->Propagator).data_._M_string_length = 0;
  (this->Propagator).data_.field_2._M_local_buf[0] = '\0';
  local_48 = &(this->DoInitialOptimization).super_ParameterBase;
  local_c8 = &(this->DoInitialOptimization).super_ParameterBase.keyword_.field_2;
  (this->DoInitialOptimization).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_c8;
  (this->DoInitialOptimization).super_ParameterBase.keyword_._M_string_length = 0;
  (this->DoInitialOptimization).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->DoInitialOptimization).super_ParameterBase.optional_ = false;
  (this->DoInitialOptimization).super_ParameterBase.defaultValue_ = false;
  (this->DoInitialOptimization).super_ParameterBase.empty_ = true;
  (this->DoInitialOptimization).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002b83f0;
  (this->ChargeOptimizationMethod).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->ChargeOptimizationMethod).super_ParameterBase.keyword_.field_2;
  (this->ChargeOptimizationMethod).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ChargeOptimizationMethod).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ChargeOptimizationMethod).super_ParameterBase.optional_ = false;
  (this->ChargeOptimizationMethod).super_ParameterBase.defaultValue_ = false;
  (this->ChargeOptimizationMethod).super_ParameterBase.empty_ = true;
  (this->ChargeOptimizationMethod).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002b8078;
  (this->ChargeOptimizationMethod).data_._M_dataplus._M_p =
       (pointer)&(this->ChargeOptimizationMethod).data_.field_2;
  (this->ChargeOptimizationMethod).data_._M_string_length = 0;
  (this->ChargeOptimizationMethod).data_.field_2._M_local_buf[0] = '\0';
  local_d0 = &(this->Friction).super_ParameterBase.keyword_.field_2;
  (this->Friction).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_d0;
  (this->Friction).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Friction).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Friction).super_ParameterBase.optional_ = false;
  (this->Friction).super_ParameterBase.defaultValue_ = false;
  (this->Friction).super_ParameterBase.empty_ = true;
  (this->Friction).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002b8468;
  local_d8 = &(this->Tolerance).super_ParameterBase.keyword_.field_2;
  (this->Tolerance).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_d8;
  (this->Tolerance).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Tolerance).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Tolerance).super_ParameterBase.optional_ = false;
  (this->Tolerance).super_ParameterBase.defaultValue_ = false;
  (this->Tolerance).super_ParameterBase.empty_ = true;
  (this->Tolerance).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002b8468;
  local_e0 = &(this->MaxIterations).super_ParameterBase.keyword_.field_2;
  (this->MaxIterations).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_e0;
  (this->MaxIterations).super_ParameterBase.keyword_._M_string_length = 0;
  (this->MaxIterations).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->MaxIterations).super_ParameterBase.optional_ = false;
  (this->MaxIterations).super_ParameterBase.defaultValue_ = false;
  (this->MaxIterations).super_ParameterBase.empty_ = true;
  (this->MaxIterations).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002b84e0;
  local_e8 = &(this->TargetTemp).super_ParameterBase.keyword_.field_2;
  (this->TargetTemp).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_e8;
  (this->TargetTemp).super_ParameterBase.keyword_._M_string_length = 0;
  (this->TargetTemp).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->TargetTemp).super_ParameterBase.optional_ = false;
  (this->TargetTemp).super_ParameterBase.defaultValue_ = false;
  (this->TargetTemp).super_ParameterBase.empty_ = true;
  (this->TargetTemp).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002b8468;
  local_f0 = &(this->TauThermostat).super_ParameterBase.keyword_.field_2;
  (this->TauThermostat).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_f0;
  (this->TauThermostat).super_ParameterBase.keyword_._M_string_length = 0;
  (this->TauThermostat).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->TauThermostat).super_ParameterBase.optional_ = false;
  (this->TauThermostat).super_ParameterBase.defaultValue_ = false;
  (this->TauThermostat).super_ParameterBase.empty_ = true;
  (this->TauThermostat).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002b8468;
  local_f8 = &(this->DragCoefficient).super_ParameterBase.keyword_.field_2;
  (this->DragCoefficient).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_f8;
  (this->DragCoefficient).super_ParameterBase.keyword_._M_string_length = 0;
  (this->DragCoefficient).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->DragCoefficient).super_ParameterBase.optional_ = false;
  (this->DragCoefficient).super_ParameterBase.defaultValue_ = false;
  (this->DragCoefficient).super_ParameterBase.empty_ = true;
  (this->DragCoefficient).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002b8468;
  local_100 = &(this->ConstrainRegions).super_ParameterBase.keyword_.field_2;
  (this->ConstrainRegions).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_100;
  (this->ConstrainRegions).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ConstrainRegions).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ConstrainRegions).super_ParameterBase.optional_ = false;
  (this->ConstrainRegions).super_ParameterBase.defaultValue_ = false;
  (this->ConstrainRegions).super_ParameterBase.empty_ = true;
  (this->ConstrainRegions).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002b83f0;
  local_108 = &(this->InitialStepSize).super_ParameterBase.keyword_.field_2;
  (this->InitialStepSize).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_108;
  (this->InitialStepSize).super_ParameterBase.keyword_._M_string_length = 0;
  (this->InitialStepSize).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->InitialStepSize).super_ParameterBase.optional_ = false;
  (this->InitialStepSize).super_ParameterBase.defaultValue_ = false;
  local_40 = (string *)&(this->DoInitialOptimization).super_ParameterBase.keyword_;
  (this->InitialStepSize).super_ParameterBase.empty_ = true;
  local_50 = &(this->ChargeOptimizationMethod).super_ParameterBase;
  (this->InitialStepSize).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002b8468;
  paVar2 = &local_150.first.field_2;
  local_60 = &(this->Friction).super_ParameterBase;
  local_58 = (string *)&(this->Friction).super_ParameterBase.keyword_;
  local_70 = &(this->Tolerance).super_ParameterBase;
  local_68 = (string *)&(this->Tolerance).super_ParameterBase.keyword_;
  local_80 = &(this->MaxIterations).super_ParameterBase;
  local_78 = (string *)&(this->MaxIterations).super_ParameterBase.keyword_;
  local_90 = &(this->TargetTemp).super_ParameterBase;
  local_88 = (string *)&(this->TargetTemp).super_ParameterBase.keyword_;
  local_a0 = &(this->TauThermostat).super_ParameterBase;
  local_98 = (string *)&(this->TauThermostat).super_ParameterBase.keyword_;
  local_b0 = &(this->DragCoefficient).super_ParameterBase;
  local_a8 = (string *)&(this->DragCoefficient).super_ParameterBase.keyword_;
  local_c0 = &(this->ConstrainRegions).super_ParameterBase;
  local_b8 = (string *)&(this->ConstrainRegions).super_ParameterBase.keyword_;
  local_150.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"propagator","");
  std::__cxx11::string::_M_assign((string *)&(this->Propagator).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_150.first._M_dataplus._M_p,
                    local_150.first.field_2._M_allocated_capacity + 1);
  }
  (this->Propagator).super_ParameterBase.optional_ = true;
  local_150.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"Damped","");
  std::__cxx11::string::_M_assign((string *)&(this->Propagator).data_);
  (this->Propagator).super_ParameterBase.defaultValue_ = true;
  (this->Propagator).super_ParameterBase.empty_ = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_150.first._M_dataplus._M_p,
                    local_150.first.field_2._M_allocated_capacity + 1);
  }
  local_128 = &local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"propagator","");
  this_00 = &(this->super_DataHolder).parameters_;
  if (local_128 == &local_118) {
    local_150.first.field_2._8_8_ = local_118._8_8_;
    local_150.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_150.first._M_dataplus._M_p = (pointer)local_128;
  }
  local_150.first.field_2._M_allocated_capacity._1_7_ = local_118._M_allocated_capacity._1_7_;
  local_150.first.field_2._M_local_buf[0] = local_118._M_local_buf[0];
  local_150.first._M_string_length = local_120;
  local_120 = 0;
  local_118._M_local_buf[0] = '\0';
  local_150.second = local_38;
  local_128 = &local_118;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_150.first._M_dataplus._M_p,
                    local_150.first.field_2._M_allocated_capacity + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,
                    CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]) + 1);
  }
  local_150.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"doInitialOptimization","");
  std::__cxx11::string::_M_assign(local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_150.first._M_dataplus._M_p,
                    local_150.first.field_2._M_allocated_capacity + 1);
  }
  (this->DoInitialOptimization).super_ParameterBase.optional_ = true;
  (this->DoInitialOptimization).super_ParameterBase.defaultValue_ = true;
  (this->DoInitialOptimization).super_ParameterBase.empty_ = false;
  (this->DoInitialOptimization).super_ParameterBase.field_0x2b = 1;
  local_128 = &local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"doInitialOptimization","");
  if (local_128 == &local_118) {
    local_150.first.field_2._8_8_ = local_118._8_8_;
    local_150.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_150.first._M_dataplus._M_p = (pointer)local_128;
  }
  local_150.first.field_2._M_allocated_capacity._1_7_ = local_118._M_allocated_capacity._1_7_;
  local_150.first.field_2._M_local_buf[0] = local_118._M_local_buf[0];
  local_150.first._M_string_length = local_120;
  local_120 = 0;
  local_118._M_local_buf[0] = '\0';
  local_150.second = local_48;
  local_128 = &local_118;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_150.first._M_dataplus._M_p,
                    local_150.first.field_2._M_allocated_capacity + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,
                    CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]) + 1);
  }
  local_150.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"method","");
  std::__cxx11::string::_M_assign
            ((string *)&(this->ChargeOptimizationMethod).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_150.first._M_dataplus._M_p,
                    local_150.first.field_2._M_allocated_capacity + 1);
  }
  (this->ChargeOptimizationMethod).super_ParameterBase.optional_ = true;
  local_150.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"CG","");
  std::__cxx11::string::_M_assign((string *)&(this->ChargeOptimizationMethod).data_);
  (this->ChargeOptimizationMethod).super_ParameterBase.defaultValue_ = true;
  (this->ChargeOptimizationMethod).super_ParameterBase.empty_ = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_150.first._M_dataplus._M_p,
                    local_150.first.field_2._M_allocated_capacity + 1);
  }
  local_128 = &local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"method","");
  if (local_128 == &local_118) {
    local_150.first.field_2._8_8_ = local_118._8_8_;
    local_150.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_150.first._M_dataplus._M_p = (pointer)local_128;
  }
  local_150.first.field_2._M_allocated_capacity._1_7_ = local_118._M_allocated_capacity._1_7_;
  local_150.first.field_2._M_local_buf[0] = local_118._M_local_buf[0];
  local_150.first._M_string_length = local_120;
  local_120 = 0;
  local_118._M_local_buf[0] = '\0';
  local_150.second = local_50;
  local_128 = &local_118;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_150.first._M_dataplus._M_p,
                    local_150.first.field_2._M_allocated_capacity + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,
                    CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]) + 1);
  }
  local_150.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"friction","");
  std::__cxx11::string::_M_assign(local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_150.first._M_dataplus._M_p,
                    local_150.first.field_2._M_allocated_capacity + 1);
  }
  (this->Friction).super_ParameterBase.optional_ = true;
  (this->Friction).super_ParameterBase.defaultValue_ = true;
  (this->Friction).data_ = 1600.0;
  (this->Friction).super_ParameterBase.empty_ = false;
  local_128 = &local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"friction","");
  if (local_128 == &local_118) {
    local_150.first.field_2._8_8_ = local_118._8_8_;
    local_150.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_150.first._M_dataplus._M_p = (pointer)local_128;
  }
  local_150.first.field_2._M_allocated_capacity._1_7_ = local_118._M_allocated_capacity._1_7_;
  local_150.first.field_2._M_local_buf[0] = local_118._M_local_buf[0];
  local_150.first._M_string_length = local_120;
  local_120 = 0;
  local_118._M_local_buf[0] = '\0';
  local_150.second = local_60;
  local_128 = &local_118;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_150.first._M_dataplus._M_p,
                    local_150.first.field_2._M_allocated_capacity + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,
                    CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]) + 1);
  }
  local_150.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"tolerance","");
  std::__cxx11::string::_M_assign(local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_150.first._M_dataplus._M_p,
                    local_150.first.field_2._M_allocated_capacity + 1);
  }
  (this->Tolerance).super_ParameterBase.optional_ = true;
  (this->Tolerance).super_ParameterBase.defaultValue_ = true;
  (this->Tolerance).data_ = 1e-05;
  (this->Tolerance).super_ParameterBase.empty_ = false;
  local_128 = &local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"tolerance","");
  if (local_128 == &local_118) {
    local_150.first.field_2._8_8_ = local_118._8_8_;
    local_150.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_150.first._M_dataplus._M_p = (pointer)local_128;
  }
  local_150.first.field_2._M_allocated_capacity._1_7_ = local_118._M_allocated_capacity._1_7_;
  local_150.first.field_2._M_local_buf[0] = local_118._M_local_buf[0];
  local_150.first._M_string_length = local_120;
  local_120 = 0;
  local_118._M_local_buf[0] = '\0';
  local_150.second = local_70;
  local_128 = &local_118;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_150.first._M_dataplus._M_p,
                    local_150.first.field_2._M_allocated_capacity + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,
                    CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]) + 1);
  }
  local_150.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"maxIterations","");
  std::__cxx11::string::_M_assign(local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_150.first._M_dataplus._M_p,
                    local_150.first.field_2._M_allocated_capacity + 1);
  }
  (this->MaxIterations).super_ParameterBase.optional_ = true;
  (this->MaxIterations).super_ParameterBase.defaultValue_ = true;
  *(undefined4 *)&(this->MaxIterations).super_ParameterBase.field_0x2c = 100;
  (this->MaxIterations).super_ParameterBase.empty_ = false;
  local_128 = &local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"maxIterations","");
  if (local_128 == &local_118) {
    local_150.first.field_2._8_8_ = local_118._8_8_;
    local_150.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_150.first._M_dataplus._M_p = (pointer)local_128;
  }
  local_150.first.field_2._M_allocated_capacity._1_7_ = local_118._M_allocated_capacity._1_7_;
  local_150.first.field_2._M_local_buf[0] = local_118._M_local_buf[0];
  local_150.first._M_string_length = local_120;
  local_120 = 0;
  local_118._M_local_buf[0] = '\0';
  local_150.second = local_80;
  local_128 = &local_118;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_150.first._M_dataplus._M_p,
                    local_150.first.field_2._M_allocated_capacity + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,
                    CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]) + 1);
  }
  local_150.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"targetTemp","");
  std::__cxx11::string::_M_assign(local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_150.first._M_dataplus._M_p,
                    local_150.first.field_2._M_allocated_capacity + 1);
  }
  (this->TargetTemp).super_ParameterBase.optional_ = true;
  (this->TargetTemp).super_ParameterBase.defaultValue_ = true;
  (this->TargetTemp).data_ = 1e-06;
  (this->TargetTemp).super_ParameterBase.empty_ = false;
  local_128 = &local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"targetTemp","");
  if (local_128 == &local_118) {
    local_150.first.field_2._8_8_ = local_118._8_8_;
    local_150.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_150.first._M_dataplus._M_p = (pointer)local_128;
  }
  local_150.first.field_2._M_allocated_capacity._1_7_ = local_118._M_allocated_capacity._1_7_;
  local_150.first.field_2._M_local_buf[0] = local_118._M_local_buf[0];
  local_150.first._M_string_length = local_120;
  local_120 = 0;
  local_118._M_local_buf[0] = '\0';
  local_150.second = local_90;
  local_128 = &local_118;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_150.first._M_dataplus._M_p,
                    local_150.first.field_2._M_allocated_capacity + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,
                    CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]) + 1);
  }
  local_150.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"tauThermostat","");
  std::__cxx11::string::_M_assign(local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_150.first._M_dataplus._M_p,
                    local_150.first.field_2._M_allocated_capacity + 1);
  }
  (this->TauThermostat).super_ParameterBase.optional_ = true;
  (this->TauThermostat).super_ParameterBase.defaultValue_ = true;
  (this->TauThermostat).data_ = 10.0;
  (this->TauThermostat).super_ParameterBase.empty_ = false;
  local_128 = &local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"tauThermostat","");
  if (local_128 == &local_118) {
    local_150.first.field_2._8_8_ = local_118._8_8_;
    local_150.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_150.first._M_dataplus._M_p = (pointer)local_128;
  }
  local_150.first.field_2._M_allocated_capacity._1_7_ = local_118._M_allocated_capacity._1_7_;
  local_150.first.field_2._M_local_buf[0] = local_118._M_local_buf[0];
  local_150.first._M_string_length = local_120;
  local_120 = 0;
  local_118._M_local_buf[0] = '\0';
  local_150.second = local_a0;
  local_128 = &local_118;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_150.first._M_dataplus._M_p,
                    local_150.first.field_2._M_allocated_capacity + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,
                    CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]) + 1);
  }
  local_150.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"dragCoefficient","");
  std::__cxx11::string::_M_assign(local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_150.first._M_dataplus._M_p,
                    local_150.first.field_2._M_allocated_capacity + 1);
  }
  (this->DragCoefficient).super_ParameterBase.optional_ = true;
  (this->DragCoefficient).super_ParameterBase.defaultValue_ = true;
  (this->DragCoefficient).data_ = 0.01;
  (this->DragCoefficient).super_ParameterBase.empty_ = false;
  local_128 = &local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"dragCoefficient","");
  if (local_128 == &local_118) {
    local_150.first.field_2._8_8_ = local_118._8_8_;
    local_150.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_150.first._M_dataplus._M_p = (pointer)local_128;
  }
  local_150.first.field_2._M_allocated_capacity._1_7_ = local_118._M_allocated_capacity._1_7_;
  local_150.first.field_2._M_local_buf[0] = local_118._M_local_buf[0];
  local_150.first._M_string_length = local_120;
  local_120 = 0;
  local_118._M_local_buf[0] = '\0';
  local_150.second = local_b0;
  local_128 = &local_118;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_150.first._M_dataplus._M_p,
                    local_150.first.field_2._M_allocated_capacity + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,
                    CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]) + 1);
  }
  local_150.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"constrainRegions","");
  std::__cxx11::string::_M_assign(local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_150.first._M_dataplus._M_p,
                    local_150.first.field_2._M_allocated_capacity + 1);
  }
  (this->ConstrainRegions).super_ParameterBase.optional_ = true;
  (this->ConstrainRegions).super_ParameterBase.defaultValue_ = true;
  (this->ConstrainRegions).super_ParameterBase.empty_ = false;
  (this->ConstrainRegions).super_ParameterBase.field_0x2b = 0;
  local_128 = &local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"constrainRegions","");
  if (local_128 == &local_118) {
    local_150.first.field_2._8_8_ = local_118._8_8_;
    local_150.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_150.first._M_dataplus._M_p = (pointer)local_128;
  }
  local_150.first.field_2._M_allocated_capacity._1_7_ = local_118._M_allocated_capacity._1_7_;
  local_150.first.field_2._M_local_buf[0] = local_118._M_local_buf[0];
  local_150.first._M_string_length = local_120;
  local_120 = 0;
  local_118._M_local_buf[0] = '\0';
  local_150.second = local_c0;
  local_128 = &local_118;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_150.first._M_dataplus._M_p,
                    local_150.first.field_2._M_allocated_capacity + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,
                    CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]) + 1);
  }
  local_150.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"initialStepSize","");
  std::__cxx11::string::_M_assign((string *)&(this->InitialStepSize).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_150.first._M_dataplus._M_p,
                    local_150.first.field_2._M_allocated_capacity + 1);
  }
  (this->InitialStepSize).super_ParameterBase.optional_ = true;
  (this->InitialStepSize).super_ParameterBase.defaultValue_ = true;
  (this->InitialStepSize).data_ = 0.1;
  (this->InitialStepSize).super_ParameterBase.empty_ = false;
  local_128 = &local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"initialStepSize","");
  if (local_128 == &local_118) {
    local_150.first.field_2._8_8_ = local_118._8_8_;
    local_150.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_150.first._M_dataplus._M_p = (pointer)local_128;
  }
  local_150.first.field_2._M_allocated_capacity._1_7_ = local_118._M_allocated_capacity._1_7_;
  local_150.first.field_2._M_local_buf[0] = local_118._M_local_buf[0];
  local_150.first._M_string_length = local_120;
  local_120 = 0;
  local_118._M_local_buf[0] = '\0';
  local_150.second = &(this->InitialStepSize).super_ParameterBase;
  local_128 = &local_118;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_150.first._M_dataplus._M_p,
                    local_150.first.field_2._M_allocated_capacity + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,
                    CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

FluctuatingChargeParameters::FluctuatingChargeParameters() {
    DefineOptionalParameterWithDefaultValue(Propagator, "propagator", "Damped");
    DefineOptionalParameterWithDefaultValue(DoInitialOptimization,
                                            "doInitialOptimization", true);
    DefineOptionalParameterWithDefaultValue(ChargeOptimizationMethod, "method",
                                            "CG");
    DefineOptionalParameterWithDefaultValue(Friction, "friction", 1600.0);
    DefineOptionalParameterWithDefaultValue(Tolerance, "tolerance", 1.0e-5);
    DefineOptionalParameterWithDefaultValue(MaxIterations, "maxIterations",
                                            100);
    DefineOptionalParameterWithDefaultValue(TargetTemp, "targetTemp", 1.0e-6);
    DefineOptionalParameterWithDefaultValue(TauThermostat, "tauThermostat",
                                            10.0);
    DefineOptionalParameterWithDefaultValue(DragCoefficient, "dragCoefficient",
                                            0.01);
    DefineOptionalParameterWithDefaultValue(ConstrainRegions,
                                            "constrainRegions", false);
    DefineOptionalParameterWithDefaultValue(InitialStepSize, "initialStepSize",
                                            0.1);
  }